

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa_hotplug.c
# Opt level: O3

int device_list_size(void)

{
  undefined8 uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  size_t sVar6;
  char *__s;
  int iVar7;
  void *__s_00;
  undefined8 uStack_80;
  char local_78 [8];
  char name [32];
  uint local_44;
  undefined8 uStack_40;
  int card;
  snd_ctl_t *handle;
  int dev;
  
  uStack_80 = 0x114f51;
  lVar5 = snd_ctl_card_info_sizeof();
  lVar5 = -(lVar5 + 0xfU & 0xfffffffffffffff0);
  __s = local_78 + lVar5;
  *(undefined8 *)((long)&uStack_80 + lVar5) = 0x114f67;
  sVar6 = snd_ctl_card_info_sizeof();
  iVar7 = 0;
  *(undefined8 *)((long)&uStack_80 + lVar5) = 0x114f7b;
  memset(__s,0,sVar6);
  *(undefined8 *)((long)&uStack_80 + lVar5) = 0x114f80;
  lVar5 = snd_pcm_info_sizeof();
  __s_00 = __s + -(lVar5 + 0xfU & 0xfffffffffffffff0);
  *(undefined8 *)((long)__s_00 + -8) = 0x114f96;
  sVar6 = snd_pcm_info_sizeof();
  *(undefined8 *)((long)__s_00 + -8) = 0x114fa3;
  memset(__s_00,0,sVar6);
  local_44 = 0xffffffff;
  *(undefined8 *)((long)__s_00 + -8) = 0x114fb5;
  uVar2 = snd_card_next(&local_44);
  if (-1 < (int)(uVar2 | local_44)) {
    iVar7 = 0;
    do {
      *(undefined8 *)((long)__s_00 + -8) = 0x114fdb;
      sprintf(local_78,"hw:%d");
      *(undefined8 *)((long)__s_00 + -8) = 0x114fe9;
      iVar3 = snd_ctl_open(&stack0xffffffffffffffc0,local_78,0);
      uVar1 = uStack_40;
      if (-1 < iVar3) {
        *(undefined8 *)((long)__s_00 + -8) = 0x114ffe;
        iVar3 = snd_ctl_card_info(uVar1,__s);
        if (-1 < iVar3) {
          handle._4_4_ = -1;
          while( true ) {
            uVar1 = uStack_40;
            *(undefined8 *)((long)__s_00 + -8) = 0x115015;
            snd_ctl_pcm_next_device(uVar1,(long)&handle + 4);
            if (handle._4_4_ < 0) break;
            *(undefined8 *)((long)__s_00 + -8) = 0x115024;
            snd_pcm_info_set_device(__s_00);
            *(undefined8 *)((long)__s_00 + -8) = 0x11502e;
            snd_pcm_info_set_subdevice(__s_00,0);
            *(undefined8 *)((long)__s_00 + -8) = 0x11503b;
            snd_pcm_info_set_stream(__s_00,1);
            uVar1 = uStack_40;
            *(undefined8 *)((long)__s_00 + -8) = 0x115047;
            uVar2 = snd_ctl_pcm_info(uVar1,__s_00);
            *(undefined8 *)((long)__s_00 + -8) = 0x115053;
            snd_pcm_info_set_stream(__s_00,0);
            uVar1 = uStack_40;
            *(undefined8 *)((long)__s_00 + -8) = 0x11505f;
            uVar4 = snd_ctl_pcm_info(uVar1,__s_00);
            if (-1 < (int)uVar4) {
              *(undefined8 *)((long)__s_00 + -8) = 0x11506e;
              snd_pcm_info_get_subdevices_count(__s_00);
            }
            iVar7 = iVar7 - ((int)~(uVar4 & uVar2) >> 0x1f);
          }
        }
        uVar1 = uStack_40;
        *(undefined8 *)((long)__s_00 + -8) = 0x115086;
        snd_ctl_close(uVar1);
      }
      *(undefined8 *)((long)__s_00 + -8) = 0x11508f;
      iVar3 = snd_card_next(&local_44);
    } while ((-1 < iVar3) && (-1 < (int)local_44));
  }
  return iVar7;
}

Assistant:

static int device_list_size(void)
{
  snd_ctl_t *handle;
  int card, err, dev, idx;
  int nb = 0;
  snd_ctl_card_info_t *info;
  snd_pcm_info_t *pcminfo;
  snd_ctl_card_info_alloca(&info);
  snd_pcm_info_alloca(&pcminfo);

  card = -1;
  if (snd_card_next(&card) < 0 || card < 0)
  {
    return nb;
  }

  while (card >= 0)
  {
    char name[32];

    sprintf(name, "hw:%d", card);
    if ((err = snd_ctl_open(&handle, name, 0)) < 0)
    {
      goto next_card;
    }
    if ((err = snd_ctl_card_info(handle, info)) < 0)
    {
      snd_ctl_close(handle);
      goto next_card;
    }
    dev = -1;
    while (1)
    {
      unsigned int count;
      int hasPlayback = 0;
      int hasCapture = 0;

      snd_ctl_pcm_next_device(handle, &dev);

      if (dev < 0)
        break;
      snd_pcm_info_set_device(pcminfo, dev);
      snd_pcm_info_set_subdevice(pcminfo, 0);
      snd_pcm_info_set_stream(pcminfo, SND_PCM_STREAM_CAPTURE);
      if ((err = snd_ctl_pcm_info(handle, pcminfo)) >= 0)
      {
        hasCapture = 1;
      }

      snd_pcm_info_set_stream(pcminfo, SND_PCM_STREAM_PLAYBACK);
      if ((err = snd_ctl_pcm_info(handle, pcminfo)) >= 0)
      {
        hasPlayback = 1;

        count = snd_pcm_info_get_subdevices_count(pcminfo);
      }

      if(hasPlayback == 0 && hasCapture == 0)
        continue;

      nb++;
    }
    snd_ctl_close(handle);
next_card:
    if (snd_card_next(&card) < 0)
    {
      break;
    }
  }
  return nb;
}